

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

void __thiscall
jsoncons::typed_array_visitor<std::vector<float,_std::allocator<float>_>_>::visit_half_
          (typed_array_visitor<std::vector<float,_std::allocator<float>_>_> *this,uint16_t param_2)

{
  vector<float,_std::allocator<float>_> *this_00;
  double dVar1;
  float local_c;
  
  this_00 = this->v_;
  dVar1 = binary::decode_half(param_2);
  local_c = (float)dVar1;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,&local_c);
  return;
}

Assistant:

void visit_half_(std::false_type, uint16_t value)
        {
            v_.push_back(static_cast<value_type>(binary::decode_half(value)));
        }